

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# try-qsort.c
# Opt level: O2

int comparewordcount_info_t(sort_order_enum order,wordcount_info_t *wcA,wordcount_info_t *wcB)

{
  if ((order != sort_order_ascending) && (order == sort_order_descending)) {
    return wcB->count - wcA->count;
  }
  return wcA->count - wcB->count;
}

Assistant:

int comparewordcount_info_t(enum sort_order_enum order, wordcount_info_t * wcA, wordcount_info_t * wcB)
{
    //printf("A=%s/%d B=%s/%d\n", wcA->word, wcA->count, wcB->word, wcB->count);
    switch (order)
    {
    case sort_order_descending:
        return -(wcA->count - wcB->count);
    case sort_order_ascending:
        return wcA->count - wcB->count;
    default: /* also sort_order_ascending */
        return wcA->count - wcB->count;
    }
}